

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int extension_is_ply(char *filename)

{
  int iVar1;
  int iVar2;
  int local_28;
  int local_24;
  int find_last_dot;
  int filename_length;
  char *filename_ptr;
  char *filename_local;
  
  local_24 = 0;
  _find_last_dot = filename;
  while (iVar2 = local_24, *_find_last_dot != '\0') {
    local_24 = local_24 + 1;
    _find_last_dot = _find_last_dot + 1;
  }
  do {
    iVar1 = iVar2;
    local_28 = iVar1 + -1;
    if (local_28 == 0) break;
    iVar2 = local_28;
  } while (filename[local_28] != '.');
  if (filename[local_28] == '.') {
    if (local_24 - local_28 == 4) {
      if ((((filename[iVar1] == 'p') || (filename[iVar1] == 'P')) &&
          ((filename[iVar1 + 1] == 'l' || (filename[iVar1 + 1] == 'L')))) &&
         ((filename[iVar1 + 2] == 'y' || (filename[iVar1 + 2] == 'Y')))) {
        filename_local._4_4_ = 1;
      }
      else {
        filename_local._4_4_ = 0;
      }
    }
    else {
      filename_local._4_4_ = 0;
    }
  }
  else {
    filename_local._4_4_ = 0;
  }
  return filename_local._4_4_;
}

Assistant:

static int extension_is_ply(const char* filename)
  {
  const char* filename_ptr = filename;
  int filename_length = 0;
  while (*filename_ptr++)
    ++filename_length;

  int find_last_dot = filename_length - 1;
  while (find_last_dot)
    {
    if (filename[find_last_dot] == '.')
      break;
    --find_last_dot;
    }
  if (filename[find_last_dot] != '.')
    return 0;
  if ((filename_length - find_last_dot) != 4)
    return 0;
  if ((filename[find_last_dot + 1] == 'p' || filename[find_last_dot + 1] == 'P') &&
    (filename[find_last_dot + 2] == 'l' || filename[find_last_dot + 2] == 'L') &&
    (filename[find_last_dot + 3] == 'y' || filename[find_last_dot + 3] == 'Y'))
    return 1;
  return 0;
  }